

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EventTriggerStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventTriggerStatementSyntax,slang::syntax::SyntaxKind&,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::TimingControlSyntax*&,slang::syntax::NameSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          TimingControlSyntax **args_4,NameSyntax *args_5,Token *args_6)

{
  TimingControlSyntax *pTVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  EventTriggerStatementSyntax *this_00;
  
  this_00 = (EventTriggerStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EventTriggerStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (EventTriggerStatementSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar4 = args_3->kind;
  uVar5 = args_3->field_0x2;
  NVar6.raw = (args_3->numFlags).raw;
  uVar7 = args_3->rawLen;
  pIVar2 = args_3->info;
  pTVar1 = *args_4;
  TVar8 = args_6->kind;
  uVar9 = args_6->field_0x2;
  NVar10.raw = (args_6->numFlags).raw;
  uVar11 = args_6->rawLen;
  pIVar3 = args_6->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,*args,*args_1,args_2);
  (this_00->trigger).kind = TVar4;
  (this_00->trigger).field_0x2 = uVar5;
  (this_00->trigger).numFlags = (NumericTokenFlags)NVar6.raw;
  (this_00->trigger).rawLen = uVar7;
  (this_00->trigger).info = pIVar2;
  this_00->timing = pTVar1;
  (this_00->name).ptr = args_5;
  (this_00->semi).kind = TVar8;
  (this_00->semi).field_0x2 = uVar9;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar10.raw;
  (this_00->semi).rawLen = uVar11;
  (this_00->semi).info = pIVar3;
  if (pTVar1 != (TimingControlSyntax *)0x0) {
    (pTVar1->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  }
  (args_5->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }